

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O2

int lj_cf_io_method___tostring(lua_State *L)

{
  IOFileUD *pIVar1;
  
  pIVar1 = io_tofilep(L);
  if (pIVar1->fp == (FILE *)0x0) {
    lua_pushlstring(L,"file (closed)",0xd);
  }
  else {
    lua_pushfstring(L,"file (%p)");
  }
  return 1;
}

Assistant:

LJLIB_CF(io_method___tostring)
{
  IOFileUD *iof = io_tofilep(L);
  if (iof->fp != NULL)
    lua_pushfstring(L, "file (%p)", iof->fp);
  else
    lua_pushliteral(L, "file (closed)");
  return 1;
}